

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O0

void base_rotate_right(cpu_registers *registers,uint8_t *value_to_rotate)

{
  _Bool _Var1;
  undefined1 local_19;
  uint8_t result;
  uint8_t *value_to_rotate_local;
  cpu_registers *registers_local;
  
  local_19 = (byte)((int)(uint)*value_to_rotate >> 1);
  _Var1 = get_cpu_flag(registers,'\x01');
  if (_Var1) {
    local_19 = local_19 | 0x80;
  }
  if ((*value_to_rotate & 1) == 0) {
    clear_cpu_flag(registers,'\x01');
  }
  else {
    set_cpu_flag(registers,'\x01');
  }
  *value_to_rotate = local_19;
  determine_zero_flag(registers,*value_to_rotate);
  determine_negative_flag(registers,*value_to_rotate);
  return;
}

Assistant:

void base_rotate_right(cpu_registers* registers, uint8_t* value_to_rotate) {
    uint8_t result = *value_to_rotate >> 1;
    if(get_cpu_flag(registers, CARRY_FLAG)) result |= 0x80;
    else result &= ~0x80;
    if(*value_to_rotate & BIT0_BITMASK) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);
    *value_to_rotate = result;
    determine_zero_flag(registers, *value_to_rotate);
    determine_negative_flag(registers, *value_to_rotate);
}